

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void av1_remove_primary_compressor(AV1_PRIMARY *ppi)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  EncWorkerData *memblk;
  ThreadData_conflict *td;
  int iVar4;
  int x;
  uint32_t *(*papuVar5) [2];
  int y;
  int num_planes;
  long lVar6;
  YV12_BUFFER_CONFIG *ybf;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if (ppi != (AV1_PRIMARY *)0x0) {
    av1_tf_info_free(&ppi->tf_info);
    for (lVar6 = 0xb57; lVar6 != 0xb77; lVar6 = lVar6 + 1) {
      aom_free(ppi->parallel_cpi[lVar6]);
    }
    av1_lookahead_destroy(ppi->lookahead);
    aom_free(ppi->tpl_sb_rdmult_scaling_factors);
    ppi->tpl_sb_rdmult_scaling_factors = (double *)0x0;
    aom_free((ppi->tpl_data).txfm_stats_list);
    ybf = (ppi->tpl_data).tpl_rec_pool;
    for (lVar6 = 0x1f42; lVar6 != 0x1f72; lVar6 = lVar6 + 1) {
      aom_free(ppi->parallel_cpi[lVar6]);
      aom_free_frame_buffer(ybf);
      ppi->parallel_cpi[lVar6] = (AV1_COMP *)0x0;
      ybf = ybf + 1;
    }
    av1_tpl_dealloc(&(ppi->tpl_data).tpl_mt_sync);
    av1_terminate_workers(ppi);
    iVar4 = (ppi->p_mt_info).num_workers;
    iVar2 = (ppi->p_mt_info).num_mod_workers[1];
    if (iVar4 <= iVar2) {
      iVar2 = iVar4;
    }
    iVar3 = (ppi->p_mt_info).num_mod_workers[2];
    if (iVar4 <= iVar3) {
      iVar3 = iVar4;
    }
    bVar1 = (ppi->seq_params).use_highbitdepth;
    bVar9 = (ppi->seq_params).monochrome == '\0';
    num_planes = bVar9 + 1 + (uint)bVar9;
    for (lVar6 = 1; memblk = (ppi->p_mt_info).tile_thr_data, lVar6 < iVar4; lVar6 = lVar6 + 1) {
      td = memblk[lVar6].original_td;
      memblk[lVar6].td = td;
      if (td != (ThreadData_conflict *)0x0) {
        aom_free(td->tctx);
        aom_free(td->palette_buffer);
        aom_free(td->tmp_conv_dst);
        release_compound_type_rd_buffers(&td->comp_rd_buffer);
        for (lVar7 = 0x4ba7; lVar7 != 0x4ba9; lVar7 = lVar7 + 1) {
          aom_free((&(td->mb).plane[0].src_diff)[lVar7]);
        }
        aom_free(td->pixel_gradient_info);
        aom_free(td->src_var_info_of_4x4_sub_blocks);
        release_obmc_buffers(&td->obmc_buffer);
        aom_free(td->vt64x64);
        papuVar5 = td->hash_value_buffer;
        for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
          for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
            aom_free((*papuVar5)[lVar8]);
            (*papuVar5)[lVar8] = (uint32_t *)0x0;
          }
          papuVar5 = papuVar5 + 1;
        }
        aom_free(td->mv_costs_alloc);
        td->mv_costs_alloc = (MvCosts *)0x0;
        aom_free(td->dv_costs_alloc);
        td->dv_costs_alloc = (IntraBCMVCosts *)0x0;
        aom_free(td->counts);
        av1_free_pmc(td->firstpass_ctx,num_planes);
        td->firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
        av1_free_shared_coeff_buffer(&td->shared_coeff_buf);
        av1_free_sms_tree(td);
        if (lVar6 < iVar2) {
          tf_dealloc_data(&td->tf_data,(uint)bVar1);
        }
        if (lVar6 < iVar3) {
          tpl_dealloc_temp_buffers(&td->tpl_tmp_buffers);
        }
        gm_dealloc_data(&td->gm_data);
        av1_dealloc_mb_data(&td->mb,num_planes);
        aom_free((td->mb).sb_stats_cache);
        (td->mb).sb_stats_cache = (SB_FIRST_PASS_STATS *)0x0;
        aom_free((td->mb).sb_fp_stats);
        (td->mb).sb_fp_stats = (SB_FIRST_PASS_STATS *)0x0;
        av1_free_pc_tree_recursive(td->pc_root,num_planes,0,0,'\0');
        td->pc_root = (PC_TREE *)0x0;
        av1_dealloc_mb_wiener_var_pred_buf(td);
        aom_free(td);
        memblk[lVar6].td = (ThreadData_conflict *)0x0;
        memblk[lVar6].original_td = (ThreadData_conflict *)0x0;
        iVar4 = (ppi->p_mt_info).num_workers;
      }
    }
    aom_free(memblk);
    (ppi->p_mt_info).tile_thr_data = (EncWorkerData *)0x0;
    aom_free((ppi->p_mt_info).workers);
    (ppi->p_mt_info).workers = (AVxWorker *)0x0;
    (ppi->p_mt_info).num_workers = 0;
    aom_free(ppi);
    return;
  }
  return;
}

Assistant:

void av1_remove_primary_compressor(AV1_PRIMARY *ppi) {
  if (!ppi) return;
#if !CONFIG_REALTIME_ONLY
  av1_tf_info_free(&ppi->tf_info);
#endif  // !CONFIG_REALTIME_ONLY

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    aom_free(ppi->level_params.level_info[i]);
  }
  av1_lookahead_destroy(ppi->lookahead);

  aom_free(ppi->tpl_sb_rdmult_scaling_factors);
  ppi->tpl_sb_rdmult_scaling_factors = NULL;

  TplParams *const tpl_data = &ppi->tpl_data;
  aom_free(tpl_data->txfm_stats_list);

  for (int frame = 0; frame < MAX_LAG_BUFFERS; ++frame) {
    aom_free(tpl_data->tpl_stats_pool[frame]);
    aom_free_frame_buffer(&tpl_data->tpl_rec_pool[frame]);
    tpl_data->tpl_stats_pool[frame] = NULL;
  }

#if !CONFIG_REALTIME_ONLY
  av1_tpl_dealloc(&tpl_data->tpl_mt_sync);
#endif

  av1_terminate_workers(ppi);
  free_thread_data(ppi);

  aom_free(ppi->p_mt_info.tile_thr_data);
  ppi->p_mt_info.tile_thr_data = NULL;
  aom_free(ppi->p_mt_info.workers);
  ppi->p_mt_info.workers = NULL;
  ppi->p_mt_info.num_workers = 0;

  aom_free(ppi);
}